

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_EmitWithSubstitutionListener_Test::
~PrinterTest_EmitWithSubstitutionListener_Test(PrinterTest_EmitWithSubstitutionListener_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_PrinterTest).super_Test._vptr_Test = (_func_int **)&PTR__PrinterTest_01947710;
  if ((this->super_PrinterTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_PrinterTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  pcVar2 = (this->super_PrinterTest).out_._M_dataplus._M_p;
  paVar1 = &(this->super_PrinterTest).out_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(PrinterTest, EmitWithSubstitutionListener) {
  std::vector<std::string> seen;
  Printer printer(output());
  const auto emit = [&] {
    printer.Emit(
        {
            {"class", "Foo"},
            Printer::Sub{"var", "int x;"}.WithSuffix(";"),
        },
        R"cc(
          void $class$::foo() { $var$; }
          void $class$::set_foo() { $var$; }
        )cc");
  };
  emit();
  EXPECT_THAT(seen, ElementsAre());
  {
    auto listener = printer.WithSubstitutionListener(
        [&](auto label, auto loc) { seen.emplace_back(label); });
    emit();
  }
  EXPECT_THAT(seen, ElementsAre("class", "var", "class", "var"));

  // Still works after the listener is disconnected.
  seen.clear();
  emit();
  EXPECT_THAT(seen, ElementsAre());
}